

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall Snake::move(Snake *this)

{
  bool bVar1;
  Body *this_00;
  reference ppOVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
  local_48;
  undefined1 local_40 [16];
  reverse_iterator i;
  Point local_20;
  Body *local_18;
  PObject temp;
  Snake *this_local;
  
  temp = (PObject)this;
  bVar1 = Head::want_tail(this->head);
  if (bVar1) {
    this->points = this->points + 1;
    this_00 = (Body *)operator_new(0x28);
    Point::Point(&local_20);
    Body::Body(this_00,&local_20,this->tail);
    this->tail = (PObject)this_00;
    local_18 = this_00;
    std::vector<Object_*,_std::allocator<Object_*>_>::push_back(&this->body,&this->tail);
    Head::give_tail(this->head,false);
  }
  std::vector<Object_*,_std::allocator<Object_*>_>::rbegin
            ((vector<Object_*,_std::allocator<Object_*>_> *)(local_40 + 8));
  while( true ) {
    std::vector<Object_*,_std::allocator<Object_*>_>::rend
              ((vector<Object_*,_std::allocator<Object_*>_> *)local_40);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
                             *)(local_40 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
                             *)local_40);
    if (!bVar1) break;
    ppOVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
                           *)(local_40 + 8));
    (**(*ppOVar2)->_vptr_Object)();
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_>_>
    ::operator++(&local_48,(int)local_40 + 8);
  }
  return;
}

Assistant:

void Snake::move(){
	if (head->want_tail()){
		points++;
		PObject temp = new Body(Point(), tail);
		tail = temp;
		body.push_back(tail);
		head->give_tail(false);
	}
	for (vector<PObject>::reverse_iterator i = body.rbegin(); i != body.rend(); i++){
		(*i)->move();
	}
}